

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

void __thiscall cfd::CoinSelectionOption::InitializeTxSizeInfo(CoinSelectionOption *this)

{
  Script SVar1;
  undefined4 uVar2;
  Script *in_RDI;
  TxOutReference txout_ref;
  TxOut txout;
  Script wpkh_script;
  undefined4 in_stack_fffffffffffffe88;
  allocator *paVar3;
  undefined1 in_stack_fffffffffffffea0 [32];
  TxOutReference local_128 [80];
  Amount local_d8 [16];
  TxOut local_c8;
  allocator local_61;
  string local_60 [32];
  Script local_40;
  
  paVar3 = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"0014ffffffffffffffffffffffffffffffffffffffff",paVar3);
  cfd::core::Script::Script(&local_40,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  cfd::core::Amount::Amount(local_d8);
  cfd::core::TxOut::TxOut(&local_c8,local_d8,&local_40);
  cfd::core::TxOutReference::TxOutReference(local_128,&local_c8);
  uVar2 = cfd::core::AbstractTxOutReference::GetSerializeVsize();
  *(undefined4 *)((long)&in_RDI->_vptr_Script + 4) = uVar2;
  cfd::core::Script::Script((Script *)&stack0xfffffffffffffea0);
  SVar1._vptr_Script._4_4_ = uVar2;
  SVar1._vptr_Script._0_4_ = in_stack_fffffffffffffe88;
  SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)in_RDI;
  SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)paVar3;
  SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffea0._0_8_;
  SVar1.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
       (_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
       in_stack_fffffffffffffea0._8_24_;
  uVar2 = cfd::core::TxIn::EstimateTxInVsize
                    (kP2wpkhAddress,SVar1,(Script *)&stack0xfffffffffffffea0);
  *(undefined4 *)
   &(in_RDI->script_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = uVar2;
  core::Script::~Script(in_RDI);
  core::TxOutReference::~TxOutReference((TxOutReference *)0x3d722b);
  core::TxOut::~TxOut((TxOut *)0x3d7238);
  core::Script::~Script(in_RDI);
  return;
}

Assistant:

void CoinSelectionOption::InitializeTxSizeInfo() {
  // wpkh想定
  Script wpkh_script("0014ffffffffffffffffffffffffffffffffffffffff");
  TxOut txout(Amount(), wpkh_script);
  TxOutReference txout_ref(txout);
  change_output_size_ = txout_ref.GetSerializeVsize();
  change_spend_size_ =
      TxIn::EstimateTxInVsize(AddressType::kP2wpkhAddress, Script());
}